

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseOneof
          (Parser *this,OneofDescriptorProto *oneof_decl,DescriptorProto *containing_type,
          int oneof_index,LocationRecorder *oneof_location,
          LocationRecorder *containing_type_location,FileDescriptorProto *containing_file)

{
  Tokenizer *pTVar1;
  long *plVar2;
  size_type sVar3;
  bool bVar4;
  string *output;
  OneofOptions *options;
  FieldDescriptorProto *field;
  Arena *pAVar5;
  string_view text;
  string_view text_00;
  string_view text_01;
  LocationRecorder name_location;
  LocationRecorder local_58;
  RepeatedPtrField<google::protobuf::DescriptorProto> *local_40;
  RepeatedPtrFieldBase *local_38;
  
  text._M_str = "oneof";
  text._M_len = 5;
  bVar4 = Consume(this,text);
  if (bVar4) {
    LocationRecorder::Init(&local_58,oneof_location,oneof_location->source_code_info_);
    RepeatedField<int>::Add(&((local_58.location_)->field_0)._impl_.path_,1);
    *(byte *)&oneof_decl->field_0 = *(byte *)&oneof_decl->field_0 | 1;
    pAVar5 = (Arena *)(oneof_decl->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
    }
    output = internal::ArenaStringPtr::Mutable_abi_cxx11_
                       (&(oneof_decl->field_0)._impl_.name_,pAVar5);
    bVar4 = ConsumeIdentifier(this,output,(ErrorMaker)ZEXT816(0x3d7f61));
    LocationRecorder::~LocationRecorder(&local_58);
    if ((bVar4) &&
       (text_00._M_str = "{", text_00._M_len = 1,
       bVar4 = ConsumeEndOfDeclaration(this,text_00,oneof_location), bVar4)) {
      local_38 = &(containing_type->field_0)._impl_.field_.super_RepeatedPtrFieldBase;
      local_40 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)
                 ((long)&containing_type->field_0 + 0x20);
      do {
        pTVar1 = this->input_;
        if ((pTVar1->current_).type == TYPE_END) {
          RecordError(this,(ErrorMaker)ZEXT816(0x3d7f76));
          return false;
        }
        plVar2 = (long *)(pTVar1->current_).text._M_dataplus._M_p;
        sVar3 = (pTVar1->current_).text._M_string_length;
        if (sVar3 == 8) {
          if (((*plVar2 == 0x6465726975716572) || (*plVar2 == 0x6c616e6f6974706f)) ||
             (*plVar2 == 0x6465746165706572)) {
            RecordError(this,(ErrorMaker)ZEXT816(0x3d7fb7));
            io::Tokenizer::Next(this->input_);
          }
LAB_0020051a:
          LocationRecorder::LocationRecorder
                    (&local_58,containing_type_location,2,
                     *(int *)((long)&containing_type->field_0 + 0x10));
          field = (FieldDescriptorProto *)
                  internal::RepeatedPtrFieldBase::AddMessageLite
                            (local_38,Arena::
                                      DefaultConstruct<google::protobuf::FieldDescriptorProto>);
          bVar4 = internal::ValidateEnum(1,(uint32_t *)&FieldDescriptorProto_Label_internal_data_);
          if (!bVar4) {
            __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Label_internal_data_)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                          ,0x3a33,
                          "void google::protobuf::FieldDescriptorProto::_internal_set_label(::google::protobuf::FieldDescriptorProto_Label)"
                         );
          }
          (field->field_0)._impl_.label_ = 1;
          (field->field_0)._impl_.oneof_index_ = oneof_index;
          (field->field_0)._impl_._has_bits_.has_bits_[0] =
               (field->field_0)._impl_._has_bits_.has_bits_[0] | 0x280;
          bVar4 = ParseMessageFieldNoLabel
                            (this,field,local_40,containing_type_location,3,&local_58,
                             containing_file);
          if (!bVar4) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder(&local_58);
        }
        else {
          if ((sVar3 != 6) || (*(short *)((long)plVar2 + 4) != 0x6e6f || (int)*plVar2 != 0x6974706f)
             ) goto LAB_0020051a;
          LocationRecorder::Init(&local_58,oneof_location,oneof_location->source_code_info_);
          RepeatedField<int>::Add(&((local_58.location_)->field_0)._impl_.path_,2);
          *(byte *)&oneof_decl->field_0 = *(byte *)&oneof_decl->field_0 | 2;
          options = (oneof_decl->field_0)._impl_.options_;
          if (options == (OneofOptions *)0x0) {
            pAVar5 = (Arena *)(oneof_decl->super_Message).super_MessageLite._internal_metadata_.ptr_
            ;
            if (((ulong)pAVar5 & 1) != 0) {
              pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
            }
            options = (OneofOptions *)
                      Arena::DefaultConstruct<google::protobuf::OneofOptions>(pAVar5);
            (oneof_decl->field_0)._impl_.options_ = options;
          }
          bVar4 = ParseOption(this,&options->super_Message,&local_58,containing_file,
                              OPTION_STATEMENT);
          LocationRecorder::~LocationRecorder(&local_58);
          if (!bVar4) {
            return false;
          }
        }
        text_01._M_str = "}";
        text_01._M_len = 1;
        bVar4 = TryConsumeEndOfDeclaration(this,text_01,(LocationRecorder *)0x0);
        if (bVar4) {
          return true;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool Parser::ParseOneof(OneofDescriptorProto* oneof_decl,
                        DescriptorProto* containing_type, int oneof_index,
                        const LocationRecorder& oneof_location,
                        const LocationRecorder& containing_type_location,
                        const FileDescriptorProto* containing_file) {
  DO(Consume("oneof"));

  {
    LocationRecorder name_location(oneof_location,
                                   OneofDescriptorProto::kNameFieldNumber);
    DO(ConsumeIdentifier(oneof_decl->mutable_name(), "Expected oneof name."));
  }

  DO(ConsumeEndOfDeclaration("{", &oneof_location));

  do {
    if (AtEnd()) {
      RecordError("Reached end of input in oneof definition (missing '}').");
      return false;
    }

    if (LookingAt("option")) {
      LocationRecorder option_location(
          oneof_location, OneofDescriptorProto::kOptionsFieldNumber);
      if (!ParseOption(oneof_decl->mutable_options(), option_location,
                       containing_file, OPTION_STATEMENT)) {
        return false;
      }
      continue;
    }

    // Print a nice error if the user accidentally tries to place a label
    // on an individual member of a oneof.
    if (LookingAt("required") || LookingAt("optional") ||
        LookingAt("repeated")) {
      RecordError(
          "Fields in oneofs must not have labels (required / optional "
          "/ repeated).");
      // We can continue parsing here because we understand what the user
      // meant.  The error report will still make parsing fail overall.
      input_->Next();
    }

    LocationRecorder field_location(containing_type_location,
                                    DescriptorProto::kFieldFieldNumber,
                                    containing_type->field_size());

    FieldDescriptorProto* field = containing_type->add_field();
    field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
    field->set_oneof_index(oneof_index);

    if (!ParseMessageFieldNoLabel(field, containing_type->mutable_nested_type(),
                                  containing_type_location,
                                  DescriptorProto::kNestedTypeFieldNumber,
                                  field_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", nullptr));

  return true;
}